

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void __thiscall
cppcms::http::context::context(context *this,shared_ptr<cppcms::impl::cgi::connection> *conn)

{
  _data *p_Var1;
  response *this_00;
  service *this_01;
  manager *this_02;
  string local_40;
  
  (this->super_enable_shared_from_this<cppcms::http::context>)._M_weak_this.
  super___weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cppcms::http::context>)._M_weak_this.
  super___weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->d).ptr_ = (_data *)0x0;
  std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->conn_).
              super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>,
             &conn->super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
  p_Var1 = (_data *)operator_new(0x150);
  _data::_data(p_Var1,this);
  booster::hold_ptr<cppcms::http::context::_data>::reset(&this->d,p_Var1);
  p_Var1 = (this->d).ptr_;
  this_00 = (response *)operator_new(0x20);
  http::response::response(this_00,this);
  std::__uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>::reset
            ((__uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
              *)&p_Var1->response,this_00);
  this_01 = service(this);
  this_02 = cppcms::service::views_pool(this_01);
  views::manager::default_skin_abi_cxx11_(&local_40,this_02);
  skin(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

context::context(booster::shared_ptr<impl::cgi::connection> conn) :
	conn_(conn)
{
	d.reset(new _data(*this));
	d->response.reset(new http::response(*this));
	skin(service().views_pool().default_skin());
}